

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::upsample(Mesh *this)

{
  bool bVar1;
  Size SVar2;
  ostream *poVar3;
  VertexIter this_00;
  pointer pVVar4;
  _List_iterator<CMU462::Vertex> *in_RDI;
  VertexIter v;
  FaceCIter f;
  HalfedgeMesh *in_stack_00000228;
  MeshResampler *in_stack_00000230;
  pointer in_stack_ffffffffffffffa8;
  _Self in_stack_ffffffffffffffc0;
  _Self local_38;
  _List_node_base *local_30;
  iterator local_28;
  _List_const_iterator<CMU462::Face> local_20;
  iterator local_18;
  _List_const_iterator<CMU462::Face> local_10 [2];
  
  local_18._M_node =
       (_List_node_base *)HalfedgeMesh::facesBegin((HalfedgeMesh *)in_stack_ffffffffffffffa8);
  std::_List_const_iterator<CMU462::Face>::_List_const_iterator(local_10,&local_18);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)HalfedgeMesh::facesEnd((HalfedgeMesh *)in_stack_ffffffffffffffa8);
    std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_20,&local_28);
    bVar1 = std::operator!=(local_10,&local_20);
    if (!bVar1) {
      MeshResampler::upsample(in_stack_00000230,in_stack_00000228);
      local_38._M_node =
           (_List_node_base *)HalfedgeMesh::verticesBegin((HalfedgeMesh *)in_stack_ffffffffffffffa8)
      ;
      while( true ) {
        this_00 = HalfedgeMesh::verticesEnd((HalfedgeMesh *)in_stack_ffffffffffffffa8);
        bVar1 = std::operator!=(&local_38,(_Self *)&stack0xffffffffffffffc0);
        if (!bVar1) break;
        in_stack_ffffffffffffffa8 = std::_List_iterator<CMU462::Vertex>::operator->(in_RDI);
        pVVar4 = std::_List_iterator<CMU462::Vertex>::operator->(in_RDI);
        (pVVar4->bindPosition).x = (in_stack_ffffffffffffffa8->position).x;
        (pVVar4->bindPosition).y = (in_stack_ffffffffffffffa8->position).y;
        (pVVar4->bindPosition).z = (in_stack_ffffffffffffffa8->position).z;
        std::_List_iterator<CMU462::Vertex>::operator++(&local_38,0);
      }
      Selection::clear((Selection *)this_00._M_node);
      Selection::clear((Selection *)this_00._M_node);
      Selection::clear((Selection *)this_00._M_node);
      return;
    }
    std::_List_const_iterator<CMU462::Face>::operator->
              ((_List_const_iterator<CMU462::Face> *)0x201867);
    SVar2 = Face::degree((Face *)in_stack_ffffffffffffffc0._M_node);
    if (SVar2 != 3) break;
    local_30 = (_List_node_base *)std::_List_const_iterator<CMU462::Face>::operator++(local_10,0);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "Warning: refusing to apply Loop subdivision to surface with non-triangular faces!"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cerr,"(Try triangulating first.)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Mesh::upsample() {
  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {
    if (f->degree() != 3) {
      cerr << "Warning: refusing to apply Loop subdivision to surface with "
              "non-triangular faces!"
           << endl;
      cerr << "(Try triangulating first.)" << endl;
      return;
    }
  }
  resampler.upsample(mesh);
  // Make sure the bind position is set
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->bindPosition = v->position;
  }
  scene->selected.clear();
  scene->hovered.clear();
  scene->elementTransform->target.clear();
}